

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O3

Value * DumpTarget(Value *__return_storage_ptr__,cmGeneratorTarget *target,string *config)

{
  _Rb_tree_node_base *__k;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Base_ptr *pp_Var2;
  _Rb_tree_header *p_Var3;
  cmMakefile *this;
  cmSourceFile *this_00;
  pointer pcVar4;
  pointer pbVar5;
  string *psVar6;
  size_type sVar7;
  _func_int **pp_Var8;
  ValueHolder VVar9;
  undefined1 uVar10;
  pointer ppcVar11;
  bool bVar12;
  TargetType targetType;
  int iVar13;
  cmLocalGenerator *pcVar14;
  char *pcVar15;
  Value *pVVar16;
  Value *extraout_RAX;
  string *psVar17;
  cmListFileBacktrace *backtrace;
  OutputInfo *pOVar18;
  mapped_type *pmVar19;
  _Base_ptr p_Var20;
  cmLocalGenerator *lg;
  long *plVar21;
  mapped_type *this_01;
  size_type *psVar22;
  CommentInfo *remote;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RDX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RDX_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RDX_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in;
  string *value;
  _Alloc_hider _Var23;
  pointer __v;
  pointer ppcVar24;
  const_iterator cVar25;
  const_iterator cVar26;
  cmBacktraceRange cVar27;
  CommentInfo *local_6a0;
  string sysroot;
  string frameworkPath;
  string linkLanguageFlags;
  cmLinkLineComputer linkLineComputer;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5b8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  vStack_5a0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  languages;
  string linkPath;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData>_>_>
  languageDataMap;
  Value artifacts;
  __node_base_ptr p_Stack_4c8;
  ValueHolder local_4c0;
  undefined1 local_4b8;
  long local_4b0 [3];
  Value ttl;
  Value local_470;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> files;
  string typeName;
  string relPath;
  Value statements;
  Value sourcesValue;
  string baseDir;
  Value sourceGroupsValue;
  ValueHolder local_350;
  undefined1 local_348;
  Value crossRefs;
  Value local_300;
  Value local_2d8;
  Value local_2b0;
  Value local_288;
  Value local_260;
  Value local_238;
  Value local_210;
  Value local_1e8;
  Value local_1c0;
  Value local_198;
  Value local_170;
  Value local_148;
  Value local_120;
  Value local_f8;
  Value local_d0;
  Value local_a8;
  Value local_80;
  ValueHolder local_58;
  undefined1 local_50;
  
  pcVar14 = cmGeneratorTarget::GetLocalGenerator(target);
  cmLocalGenerator::GetState(pcVar14);
  targetType = cmGeneratorTarget::GetType(target);
  pcVar15 = cmState::GetTargetTypeName(targetType);
  std::__cxx11::string::string((string *)&typeName,pcVar15,(allocator *)&linkLineComputer);
  Json::Value::Value(&ttl,arrayValue);
  Json::Value::Value((Value *)&linkLineComputer,"EXECUTABLE");
  Json::Value::append(&ttl,(Value *)&linkLineComputer);
  Json::Value::~Value((Value *)&linkLineComputer);
  Json::Value::Value((Value *)&linkLineComputer,"STATIC_LIBRARY");
  Json::Value::append(&ttl,(Value *)&linkLineComputer);
  Json::Value::~Value((Value *)&linkLineComputer);
  Json::Value::Value((Value *)&linkLineComputer,"SHARED_LIBRARY");
  Json::Value::append(&ttl,(Value *)&linkLineComputer);
  Json::Value::~Value((Value *)&linkLineComputer);
  Json::Value::Value((Value *)&linkLineComputer,"MODULE_LIBRARY");
  Json::Value::append(&ttl,(Value *)&linkLineComputer);
  Json::Value::~Value((Value *)&linkLineComputer);
  Json::Value::Value((Value *)&linkLineComputer,"OBJECT_LIBRARY");
  Json::Value::append(&ttl,(Value *)&linkLineComputer);
  Json::Value::~Value((Value *)&linkLineComputer);
  Json::Value::Value((Value *)&linkLineComputer,"UTILITY");
  Json::Value::append(&ttl,(Value *)&linkLineComputer);
  Json::Value::~Value((Value *)&linkLineComputer);
  Json::Value::Value((Value *)&linkLineComputer,"INTERFACE_LIBRARY");
  Json::Value::append(&ttl,(Value *)&linkLineComputer);
  Json::Value::~Value((Value *)&linkLineComputer);
  bVar12 = Json::Value::isNull(&ttl);
  if (!bVar12) {
    cVar25 = Json::Value::begin(&ttl);
    cVar26 = Json::Value::end(&ttl);
    frameworkPath._M_dataplus._M_p = (pointer)&frameworkPath.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&frameworkPath,typeName._M_dataplus._M_p,
               typeName._M_dataplus._M_p + typeName._M_string_length);
    linkLanguageFlags._M_dataplus._M_p = (pointer)&linkLanguageFlags.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&linkLanguageFlags,frameworkPath._M_dataplus._M_p,
               frameworkPath._M_dataplus._M_p + frameworkPath._M_string_length);
    languageDataMap._M_t._M_impl._0_8_ =
         &languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    sourcesValue.value_.int_ = (LargestInt)cVar26.super_ValueIteratorBase.current_._M_node;
    sourcesValue._8_1_ = cVar26.super_ValueIteratorBase.isNull_;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&languageDataMap,linkLanguageFlags._M_dataplus._M_p,
               linkLanguageFlags._M_dataplus._M_p + linkLanguageFlags._M_string_length);
    languages._M_t._M_impl._0_8_ = &languages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
    ;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&languages,languageDataMap._M_t._M_impl._0_8_,
               languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ +
               languageDataMap._M_t._M_impl._0_8_);
    linkLineComputer._vptr_cmLinkLineComputer =
         (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&linkLineComputer,languages._M_t._M_impl._0_8_,
               languages._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ +
               languages._M_t._M_impl._0_8_);
    sysroot._M_dataplus._M_p = (pointer)&sysroot.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&sysroot,linkLineComputer._vptr_cmLinkLineComputer,
               (long)&((linkLineComputer.StateDir.DirectoryState.Tree)->Data).
                      super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                      ._M_impl.super__Vector_impl_data._M_start +
               (long)linkLineComputer._vptr_cmLinkLineComputer);
    if (linkLineComputer._vptr_cmLinkLineComputer !=
        (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position) {
      operator_delete(linkLineComputer._vptr_cmLinkLineComputer,
                      linkLineComputer.StateDir.DirectoryState.Position + 1);
    }
    artifacts.value_.string_ = (char *)&artifacts.comments_;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&artifacts,sysroot._M_dataplus._M_p,
               sysroot._M_dataplus._M_p + sysroot._M_string_length);
    local_4b8 = cVar25.super_ValueIteratorBase.isNull_;
    local_4c0.int_ = (LargestInt)cVar25.super_ValueIteratorBase.current_._M_node;
    local_350.int_ = (LargestInt)cVar26.super_ValueIteratorBase.current_._M_node;
    local_348 = cVar26.super_ValueIteratorBase.isNull_;
    bVar12 = Json::ValueIteratorBase::isEqual
                       ((ValueIteratorBase *)&local_4c0,(SelfType *)&local_350);
    if (!bVar12) {
      do {
        linkPath._M_dataplus._M_p = (pointer)local_4c0;
        linkPath._M_string_length = CONCAT71(linkPath._M_string_length._1_7_,local_4b8);
        pVVar16 = Json::ValueIteratorBase::deref((ValueIteratorBase *)&linkPath);
        Json::Value::asString_abi_cxx11_((string *)&linkLineComputer,pVVar16);
        pp_Var8 = linkLineComputer._vptr_cmLinkLineComputer;
        if (linkLineComputer.StateDir.DirectoryState.Tree ==
            (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)artifacts._8_8_) {
          if (linkLineComputer.StateDir.DirectoryState.Tree ==
              (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x0) {
            bVar12 = true;
          }
          else {
            iVar13 = bcmp(linkLineComputer._vptr_cmLinkLineComputer,artifacts.value_.string_,
                          (size_t)linkLineComputer.StateDir.DirectoryState.Tree);
            bVar12 = iVar13 == 0;
          }
        }
        else {
          bVar12 = false;
        }
        if (pp_Var8 != (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position) {
          operator_delete(pp_Var8,linkLineComputer.StateDir.DirectoryState.Position + 1);
        }
        if (bVar12) break;
        Json::ValueIteratorBase::increment((ValueIteratorBase *)&local_4c0);
        bVar12 = Json::ValueIteratorBase::isEqual
                           ((ValueIteratorBase *)&local_4c0,(SelfType *)&local_350);
      } while (!bVar12);
    }
    uVar10 = local_4b8;
    VVar9 = local_4c0;
    if (artifacts.value_ != &artifacts.comments_) {
      operator_delete(artifacts.value_.string_,(ulong)((long)&(artifacts.comments_)->comment_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sysroot._M_dataplus._M_p != &sysroot.field_2) {
      operator_delete(sysroot._M_dataplus._M_p,
                      CONCAT35(sysroot.field_2._M_allocated_capacity._5_3_,
                               sysroot.field_2._M_allocated_capacity._0_5_) + 1);
    }
    if ((_Base_ptr *)languages._M_t._M_impl._0_8_ !=
        &languages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)languages._M_t._M_impl._0_8_,
                      (ulong)((long)&(languages._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
    local_58.int_ = VVar9.int_;
    local_50 = uVar10;
    bVar12 = Json::ValueIteratorBase::isEqual
                       ((ValueIteratorBase *)&sourcesValue,(SelfType *)&local_58);
    pp_Var2 = &languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if ((_Base_ptr *)languageDataMap._M_t._M_impl._0_8_ != pp_Var2) {
      operator_delete((void *)languageDataMap._M_t._M_impl._0_8_,
                      (ulong)((long)&(languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent)->_M_color + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)linkLanguageFlags._M_dataplus._M_p != &linkLanguageFlags.field_2) {
      operator_delete(linkLanguageFlags._M_dataplus._M_p,
                      linkLanguageFlags.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)frameworkPath._M_dataplus._M_p != &frameworkPath.field_2) {
      operator_delete(frameworkPath._M_dataplus._M_p,frameworkPath.field_2._M_allocated_capacity + 1
                     );
    }
    paVar1 = &sysroot.field_2;
    if ((!bVar12) && (bVar12 = cmGeneratorTarget::IsImported(target), !bVar12)) {
      Json::Value::Value(__return_storage_ptr__,objectValue);
      psVar17 = cmGeneratorTarget::GetName_abi_cxx11_(target);
      Json::Value::Value(&local_80,psVar17);
      pVVar16 = Json::Value::operator[](__return_storage_ptr__,&kNAME_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar16,&local_80);
      Json::Value::~Value(&local_80);
      Json::Value::Value(&local_a8,&typeName);
      pVVar16 = Json::Value::operator[](__return_storage_ptr__,&kTYPE_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar16,&local_a8);
      Json::Value::~Value(&local_a8);
      pcVar15 = cmLocalGenerator::GetCurrentSourceDirectory(pcVar14);
      Json::Value::Value(&local_d0,pcVar15);
      pVVar16 = Json::Value::operator[](__return_storage_ptr__,&kSOURCE_DIRECTORY_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar16,&local_d0);
      Json::Value::~Value(&local_d0);
      pcVar15 = cmLocalGenerator::GetCurrentBinaryDirectory(pcVar14);
      Json::Value::Value(&local_f8,pcVar15);
      pVVar16 = Json::Value::operator[](__return_storage_ptr__,&kBUILD_DIRECTORY_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar16,&local_f8);
      Json::Value::~Value(&local_f8);
      if (targetType != INTERFACE_LIBRARY) {
        cmGeneratorTarget::GetFullName
                  ((string *)&linkLineComputer,target,config,RuntimeBinaryArtifact);
        Json::Value::Value(&local_120,(string *)&linkLineComputer);
        pVVar16 = Json::Value::operator[](__return_storage_ptr__,&kFULL_NAME_KEY_abi_cxx11_);
        Json::Value::operator=(pVVar16,&local_120);
        Json::Value::~Value(&local_120);
        if (linkLineComputer._vptr_cmLinkLineComputer !=
            (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position) {
          operator_delete(linkLineComputer._vptr_cmLinkLineComputer,
                          linkLineComputer.StateDir.DirectoryState.Position + 1);
        }
        Json::Value::Value(&crossRefs,objectValue);
        backtrace = cmTarget::GetBacktrace(target->Target);
        DumpBacktrace(&local_148,backtrace);
        pVVar16 = Json::Value::operator[](&crossRefs,&kBACKTRACE_KEY_abi_cxx11_);
        Json::Value::operator=(pVVar16,&local_148);
        Json::Value::~Value(&local_148);
        Json::Value::Value(&statements,arrayValue);
        linkLineComputer._vptr_cmLinkLineComputer =
             (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&linkLineComputer,"target_compile_definitions","");
        cVar27 = cmTarget::GetCompileDefinitionsBacktraces(target->Target);
        DumpBacktraceRange(&statements,(string *)&linkLineComputer,
                           (cmBacktraceRange *)cVar27.Begin._M_current._M_current);
        if (linkLineComputer._vptr_cmLinkLineComputer !=
            (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position) {
          operator_delete(linkLineComputer._vptr_cmLinkLineComputer,
                          linkLineComputer.StateDir.DirectoryState.Position + 1);
        }
        linkLineComputer._vptr_cmLinkLineComputer =
             (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&linkLineComputer,"target_include_directories","");
        cVar27 = cmTarget::GetIncludeDirectoriesBacktraces(target->Target);
        DumpBacktraceRange(&statements,(string *)&linkLineComputer,
                           (cmBacktraceRange *)cVar27.Begin._M_current._M_current);
        if (linkLineComputer._vptr_cmLinkLineComputer !=
            (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position) {
          operator_delete(linkLineComputer._vptr_cmLinkLineComputer,
                          linkLineComputer.StateDir.DirectoryState.Position + 1);
        }
        linkLineComputer._vptr_cmLinkLineComputer =
             (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&linkLineComputer,"target_compile_options","");
        cVar27 = cmTarget::GetCompileOptionsBacktraces(target->Target);
        DumpBacktraceRange(&statements,(string *)&linkLineComputer,
                           (cmBacktraceRange *)cVar27.Begin._M_current._M_current);
        if (linkLineComputer._vptr_cmLinkLineComputer !=
            (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position) {
          operator_delete(linkLineComputer._vptr_cmLinkLineComputer,
                          linkLineComputer.StateDir.DirectoryState.Position + 1);
        }
        linkLineComputer._vptr_cmLinkLineComputer =
             (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&linkLineComputer,"target_link_libraries","");
        cVar27 = cmTarget::GetLinkImplementationBacktraces(target->Target);
        DumpBacktraceRange(&statements,(string *)&linkLineComputer,
                           (cmBacktraceRange *)cVar27.Begin._M_current._M_current);
        if (linkLineComputer._vptr_cmLinkLineComputer !=
            (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position) {
          operator_delete(linkLineComputer._vptr_cmLinkLineComputer,
                          linkLineComputer.StateDir.DirectoryState.Position + 1);
        }
        Json::Value::Value(&local_170,&statements);
        pVVar16 = Json::Value::operator[](&crossRefs,&kRELATED_STATEMENTS_KEY_abi_cxx11_);
        Json::Value::operator=(pVVar16,&local_170);
        Json::Value::~Value(&local_170);
        Json::Value::Value(&local_198,&crossRefs);
        pVVar16 = Json::Value::operator[]
                            (__return_storage_ptr__,&kTARGET_CROSS_REFERENCES_KEY_abi_cxx11_);
        Json::Value::operator=(pVVar16,&local_198);
        Json::Value::~Value(&local_198);
        bVar12 = cmGeneratorTarget::HaveWellDefinedOutputFiles(target);
        if (bVar12) {
          Json::Value::Value(&artifacts,arrayValue);
          cmGeneratorTarget::GetFullPath(&sysroot,target,config,RuntimeBinaryArtifact,false);
          Json::Value::Value((Value *)&linkLineComputer,&sysroot);
          Json::Value::append(&artifacts,(Value *)&linkLineComputer);
          Json::Value::~Value((Value *)&linkLineComputer);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sysroot._M_dataplus._M_p != paVar1) {
            operator_delete(sysroot._M_dataplus._M_p,
                            CONCAT35(sysroot.field_2._M_allocated_capacity._5_3_,
                                     sysroot.field_2._M_allocated_capacity._0_5_) + 1);
          }
          bVar12 = cmGeneratorTarget::IsDLLPlatform(target);
          if (bVar12) {
            cmGeneratorTarget::GetFullPath(&sysroot,target,config,ImportLibraryArtifact,false);
            Json::Value::Value((Value *)&linkLineComputer,&sysroot);
            Json::Value::append(&artifacts,(Value *)&linkLineComputer);
            Json::Value::~Value((Value *)&linkLineComputer);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)sysroot._M_dataplus._M_p != paVar1) {
              operator_delete(sysroot._M_dataplus._M_p,
                              CONCAT35(sysroot.field_2._M_allocated_capacity._5_3_,
                                       sysroot.field_2._M_allocated_capacity._0_5_) + 1);
            }
            pOVar18 = cmGeneratorTarget::GetOutputInfo(target,config);
            if ((pOVar18 != (OutputInfo *)0x0) && ((pOVar18->PdbDir)._M_string_length != 0)) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &languages,&pOVar18->PdbDir,'/');
              cmGeneratorTarget::GetPDBName((string *)&languageDataMap,target,config);
              std::operator+(&sysroot,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&languages,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &languageDataMap);
              Json::Value::Value((Value *)&linkLineComputer,&sysroot);
              Json::Value::append(&artifacts,(Value *)&linkLineComputer);
              Json::Value::~Value((Value *)&linkLineComputer);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)sysroot._M_dataplus._M_p != paVar1) {
                operator_delete(sysroot._M_dataplus._M_p,
                                CONCAT35(sysroot.field_2._M_allocated_capacity._5_3_,
                                         sysroot.field_2._M_allocated_capacity._0_5_) + 1);
              }
              if ((_Base_ptr *)languageDataMap._M_t._M_impl._0_8_ != pp_Var2) {
                operator_delete((void *)languageDataMap._M_t._M_impl._0_8_,
                                (ulong)((long)&(languageDataMap._M_t._M_impl.super__Rb_tree_header.
                                                _M_header._M_parent)->_M_color + 1));
              }
              if ((_Base_ptr *)languages._M_t._M_impl._0_8_ !=
                  &languages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                operator_delete((void *)languages._M_t._M_impl._0_8_,
                                (ulong)((long)&(languages._M_t._M_impl.super__Rb_tree_header.
                                                _M_header._M_parent)->_M_color + 1));
              }
            }
          }
          Json::Value::Value(&local_1c0,&artifacts);
          pVVar16 = Json::Value::operator[](__return_storage_ptr__,&kARTIFACTS_KEY_abi_cxx11_);
          Json::Value::operator=(pVVar16,&local_1c0);
          Json::Value::~Value(&local_1c0);
          cmGeneratorTarget::GetLinkerLanguage((string *)&linkLineComputer,target,config);
          Json::Value::Value(&local_1e8,(string *)&linkLineComputer);
          pVVar16 = Json::Value::operator[](__return_storage_ptr__,&kLINKER_LANGUAGE_KEY_abi_cxx11_)
          ;
          Json::Value::operator=(pVVar16,&local_1e8);
          Json::Value::~Value(&local_1e8);
          if (linkLineComputer._vptr_cmLinkLineComputer !=
              (_func_int **)&linkLineComputer.StateDir.DirectoryState.Position) {
            operator_delete(linkLineComputer._vptr_cmLinkLineComputer,
                            linkLineComputer.StateDir.DirectoryState.Position + 1);
          }
          languages._M_t._M_impl._0_8_ =
               &languages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          languages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          languages._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          languages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)
               ((ulong)languages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent &
               0xffffffffffffff00);
          languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)
               ((ulong)languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent &
               0xffffffffffffff00);
          linkLanguageFlags._M_dataplus._M_p = (pointer)&linkLanguageFlags.field_2;
          linkLanguageFlags._M_string_length = 0;
          linkLanguageFlags.field_2._M_allocated_capacity =
               linkLanguageFlags.field_2._M_allocated_capacity & 0xffffffffffffff00;
          frameworkPath._M_string_length = 0;
          frameworkPath.field_2._M_allocated_capacity =
               frameworkPath.field_2._M_allocated_capacity & 0xffffffffffffff00;
          linkPath._M_string_length = 0;
          linkPath.field_2._M_local_buf[0] = '\0';
          frameworkPath._M_dataplus._M_p = (pointer)&frameworkPath.field_2;
          linkPath._M_dataplus._M_p = (pointer)&linkPath.field_2;
          languageDataMap._M_t._M_impl._0_8_ = pp_Var2;
          cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&local_4c0,pcVar14);
          cmStateSnapshot::GetDirectory((cmStateDirectory *)&sysroot,(cmStateSnapshot *)&local_4c0);
          cmLinkLineComputer::cmLinkLineComputer
                    (&linkLineComputer,&pcVar14->super_cmOutputConverter,
                     (cmStateDirectory *)&sysroot);
          cmLocalGenerator::GetTargetFlags
                    (pcVar14,&linkLineComputer,config,(string *)&languages,&linkLanguageFlags,
                     (string *)&languageDataMap,&frameworkPath,&linkPath,target);
          cmSystemTools::TrimWhitespace(&sysroot,(string *)&languages);
          std::__cxx11::string::operator=((string *)&languages,(string *)&sysroot);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sysroot._M_dataplus._M_p != paVar1) {
            operator_delete(sysroot._M_dataplus._M_p,
                            CONCAT35(sysroot.field_2._M_allocated_capacity._5_3_,
                                     sysroot.field_2._M_allocated_capacity._0_5_) + 1);
          }
          cmSystemTools::TrimWhitespace(&sysroot,(string *)&languageDataMap);
          std::__cxx11::string::operator=((string *)&languageDataMap,(string *)&sysroot);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sysroot._M_dataplus._M_p != paVar1) {
            operator_delete(sysroot._M_dataplus._M_p,
                            CONCAT35(sysroot.field_2._M_allocated_capacity._5_3_,
                                     sysroot.field_2._M_allocated_capacity._0_5_) + 1);
          }
          cmSystemTools::TrimWhitespace(&sysroot,&linkLanguageFlags);
          std::__cxx11::string::operator=((string *)&linkLanguageFlags,(string *)&sysroot);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sysroot._M_dataplus._M_p != paVar1) {
            operator_delete(sysroot._M_dataplus._M_p,
                            CONCAT35(sysroot.field_2._M_allocated_capacity._5_3_,
                                     sysroot.field_2._M_allocated_capacity._0_5_) + 1);
          }
          cmSystemTools::TrimWhitespace(&sysroot,&frameworkPath);
          std::__cxx11::string::operator=((string *)&frameworkPath,(string *)&sysroot);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sysroot._M_dataplus._M_p != paVar1) {
            operator_delete(sysroot._M_dataplus._M_p,
                            CONCAT35(sysroot.field_2._M_allocated_capacity._5_3_,
                                     sysroot.field_2._M_allocated_capacity._0_5_) + 1);
          }
          cmSystemTools::TrimWhitespace(&sysroot,&linkPath);
          std::__cxx11::string::operator=((string *)&linkPath,(string *)&sysroot);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sysroot._M_dataplus._M_p != paVar1) {
            operator_delete(sysroot._M_dataplus._M_p,
                            CONCAT35(sysroot.field_2._M_allocated_capacity._5_3_,
                                     sysroot.field_2._M_allocated_capacity._0_5_) + 1);
          }
          cmSystemTools::TrimWhitespace(&sysroot,(string *)&languages);
          sVar7 = sysroot._M_string_length;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sysroot._M_dataplus._M_p != paVar1) {
            operator_delete(sysroot._M_dataplus._M_p,
                            CONCAT35(sysroot.field_2._M_allocated_capacity._5_3_,
                                     sysroot.field_2._M_allocated_capacity._0_5_) + 1);
          }
          if (sVar7 != 0) {
            Json::Value::Value(&local_210,(string *)&languages);
            pVVar16 = Json::Value::operator[]
                                (__return_storage_ptr__,&kLINK_LIBRARIES_KEY_abi_cxx11_);
            Json::Value::operator=(pVVar16,&local_210);
            Json::Value::~Value(&local_210);
          }
          cmSystemTools::TrimWhitespace(&sysroot,(string *)&languageDataMap);
          sVar7 = sysroot._M_string_length;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sysroot._M_dataplus._M_p != paVar1) {
            operator_delete(sysroot._M_dataplus._M_p,
                            CONCAT35(sysroot.field_2._M_allocated_capacity._5_3_,
                                     sysroot.field_2._M_allocated_capacity._0_5_) + 1);
          }
          if (sVar7 != 0) {
            Json::Value::Value(&local_238,(string *)&languageDataMap);
            pVVar16 = Json::Value::operator[](__return_storage_ptr__,&kLINK_FLAGS_KEY_abi_cxx11_);
            Json::Value::operator=(pVVar16,&local_238);
            Json::Value::~Value(&local_238);
          }
          cmSystemTools::TrimWhitespace(&sysroot,&linkLanguageFlags);
          sVar7 = sysroot._M_string_length;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sysroot._M_dataplus._M_p != paVar1) {
            operator_delete(sysroot._M_dataplus._M_p,
                            CONCAT35(sysroot.field_2._M_allocated_capacity._5_3_,
                                     sysroot.field_2._M_allocated_capacity._0_5_) + 1);
          }
          if (sVar7 != 0) {
            Json::Value::Value(&local_260,&linkLanguageFlags);
            pVVar16 = Json::Value::operator[]
                                (__return_storage_ptr__,&kLINK_LANGUAGE_FLAGS_KEY_abi_cxx11_);
            Json::Value::operator=(pVVar16,&local_260);
            Json::Value::~Value(&local_260);
          }
          if (frameworkPath._M_string_length != 0) {
            Json::Value::Value(&local_288,&frameworkPath);
            pVVar16 = Json::Value::operator[]
                                (__return_storage_ptr__,&kFRAMEWORK_PATH_KEY_abi_cxx11_);
            Json::Value::operator=(pVVar16,&local_288);
            Json::Value::~Value(&local_288);
          }
          if (linkPath._M_string_length != 0) {
            Json::Value::Value(&local_2b0,&linkPath);
            pVVar16 = Json::Value::operator[](__return_storage_ptr__,&kLINK_PATH_KEY_abi_cxx11_);
            Json::Value::operator=(pVVar16,&local_2b0);
            Json::Value::~Value(&local_2b0);
          }
          this = pcVar14->Makefile;
          local_4c0.string_ = (char *)local_4b0;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c0,"CMAKE_SYSROOT","");
          pcVar15 = cmMakefile::GetSafeDefinition(this,(string *)&local_4c0);
          std::__cxx11::string::string((string *)&sysroot,pcVar15,(allocator *)&local_350.bool_);
          if (local_4c0 != local_4b0) {
            operator_delete(local_4c0.string_,local_4b0[0] + 1);
          }
          if (sysroot._M_string_length != 0) {
            Json::Value::Value(&local_2d8,&sysroot);
            pVVar16 = Json::Value::operator[](__return_storage_ptr__,&kSYSROOT_KEY_abi_cxx11_);
            Json::Value::operator=(pVVar16,&local_2d8);
            Json::Value::~Value(&local_2d8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sysroot._M_dataplus._M_p != paVar1) {
            operator_delete(sysroot._M_dataplus._M_p,
                            CONCAT35(sysroot.field_2._M_allocated_capacity._5_3_,
                                     sysroot.field_2._M_allocated_capacity._0_5_) + 1);
          }
          cmLinkLineComputer::~cmLinkLineComputer(&linkLineComputer);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)linkPath._M_dataplus._M_p != &linkPath.field_2) {
            operator_delete(linkPath._M_dataplus._M_p,
                            CONCAT71(linkPath.field_2._M_allocated_capacity._1_7_,
                                     linkPath.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)frameworkPath._M_dataplus._M_p != &frameworkPath.field_2) {
            operator_delete(frameworkPath._M_dataplus._M_p,
                            frameworkPath.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)linkLanguageFlags._M_dataplus._M_p != &linkLanguageFlags.field_2) {
            operator_delete(linkLanguageFlags._M_dataplus._M_p,
                            linkLanguageFlags.field_2._M_allocated_capacity + 1);
          }
          if ((_Base_ptr *)languageDataMap._M_t._M_impl._0_8_ !=
              &languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
            operator_delete((void *)languageDataMap._M_t._M_impl._0_8_,
                            (ulong)((long)&(languageDataMap._M_t._M_impl.super__Rb_tree_header.
                                            _M_header._M_parent)->_M_color + 1));
          }
          if ((_Base_ptr *)languages._M_t._M_impl._0_8_ !=
              &languages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
            operator_delete((void *)languages._M_t._M_impl._0_8_,
                            (ulong)((long)&(languages._M_t._M_impl.super__Rb_tree_header._M_header.
                                           _M_parent)->_M_color + 1));
          }
          Json::Value::~Value(&artifacts);
        }
        p_Var3 = &languages._M_t._M_impl.super__Rb_tree_header;
        languages._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             languages._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
        languages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        languages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        languages._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
        languages._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
        cmGeneratorTarget::GetLanguages(target,&languages,config);
        languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header;
        languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
             languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000
        ;
        languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        languageDataMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             languageDataMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        if ((_Rb_tree_header *)languages._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
            p_Var3) {
          p_Var20 = languages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          do {
            __k = p_Var20 + 1;
            pmVar19 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData>_>_>
                      ::operator[](&languageDataMap,(key_type *)__k);
            std::__cxx11::string::_M_assign((string *)&pmVar19->Language);
            cmLocalGenerator::GetTargetCompileFlags
                      (pcVar14,target,config,(string *)__k,&pmVar19->Flags);
            linkLineComputer.StateDir.DirectoryState.Tree =
                 (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)
                 ((ulong)linkLineComputer.StateDir.DirectoryState.Tree & 0xffffffff00000000);
            linkLineComputer.StateDir.DirectoryState.Position = 0;
            linkLineComputer.StateDir.Snapshot_.State = (cmState *)&linkLineComputer.StateDir;
            linkLineComputer.StateDir.Snapshot_.Position.Position = 0;
            linkLineComputer.StateDir.Snapshot_.Position.Tree =
                 (cmLinkedTree<cmStateDetail::SnapshotDataType> *)
                 linkLineComputer.StateDir.Snapshot_.State;
            cmLocalGenerator::GetTargetDefines
                      (pcVar14,target,config,(string *)__k,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&linkLineComputer);
            LanguageData::SetDefines
                      (pmVar19,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&linkLineComputer);
            linkLanguageFlags._M_dataplus._M_p = (pointer)0x0;
            linkLanguageFlags._M_string_length = 0;
            linkLanguageFlags.field_2._M_allocated_capacity = 0;
            cmLocalGenerator::GetIncludeDirectories
                      (pcVar14,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&linkLanguageFlags,target,(string *)__k,config,true);
            sVar7 = linkLanguageFlags._M_string_length;
            if (linkLanguageFlags._M_dataplus._M_p != (pointer)linkLanguageFlags._M_string_length) {
              _Var23 = linkLanguageFlags._M_dataplus;
              do {
                sysroot._M_dataplus._M_p = (pointer)&sysroot.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&sysroot,*(long *)_Var23._M_p,
                           *(long *)((long)_Var23._M_p + 8) + *(long *)_Var23._M_p);
                bVar12 = cmGeneratorTarget::IsSystemIncludeDirectory(target,&sysroot,config);
                artifacts.value_.string_ = (char *)&artifacts.comments_;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&artifacts,sysroot._M_dataplus._M_p,
                           sysroot._M_dataplus._M_p + sysroot._M_string_length);
                artifacts.limit_._0_1_ = bVar12;
                std::
                vector<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>
                ::emplace_back<std::pair<std::__cxx11::string,bool>>
                          ((vector<std::pair<std::__cxx11::string,bool>,std::allocator<std::pair<std::__cxx11::string,bool>>>
                            *)&pmVar19->IncludePathList,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
                            *)&artifacts);
                if (artifacts.value_ != &artifacts.comments_) {
                  operator_delete(artifacts.value_.string_,
                                  (ulong)((long)&(artifacts.comments_)->comment_ + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)sysroot._M_dataplus._M_p != &sysroot.field_2) {
                  operator_delete(sysroot._M_dataplus._M_p,
                                  CONCAT35(sysroot.field_2._M_allocated_capacity._5_3_,
                                           sysroot.field_2._M_allocated_capacity._0_5_) + 1);
                }
                _Var23._M_p = _Var23._M_p + 0x20;
              } while (_Var23._M_p != (pointer)sVar7);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&linkLanguageFlags);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&linkLineComputer);
            p_Var20 = (_Base_ptr)std::_Rb_tree_increment(p_Var20);
          } while ((_Rb_tree_header *)p_Var20 != &languages._M_t._M_impl.super__Rb_tree_header);
        }
        files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        cmGeneratorTarget::GetSourceFiles(target,&files,config);
        ppcVar11 = files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
                   .super__Vector_impl_data._M_finish;
        artifacts.value_.string_ = (char *)&p_Stack_4c8;
        artifacts._8_8_ = 1;
        artifacts.comments_ = (CommentInfo *)0x0;
        artifacts.start_ = 0;
        artifacts.limit_._0_4_ = 0x3f800000;
        p_Stack_4c8 = (__node_base_ptr)0x0;
        for (ppcVar24 = files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                        _M_impl.super__Vector_impl_data._M_start; ppcVar24 != ppcVar11;
            ppcVar24 = ppcVar24 + 1) {
          linkLineComputer.StateDir.DirectoryState.Tree =
               (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)
               &linkLineComputer.StateDir.Snapshot_;
          this_00 = *ppcVar24;
          linkLineComputer._vptr_cmLinkLineComputer =
               (_func_int **)((ulong)linkLineComputer._vptr_cmLinkLineComputer & 0xffffffffffffff00)
          ;
          linkLineComputer.StateDir.DirectoryState.Position = 0;
          linkLineComputer.StateDir.Snapshot_.State =
               (cmState *)((ulong)linkLineComputer.StateDir.Snapshot_.State & 0xffffffffffffff00);
          linkLineComputer.StateDir.Snapshot_.Position.Position =
               (PositionType)&linkLineComputer.ForResponse;
          linkLineComputer.OutputConverter = (cmOutputConverter *)0x0;
          linkLineComputer.ForResponse = false;
          vStack_5a0.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          vStack_5a0.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_5b8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          vStack_5a0.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_5b8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_5b8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          cmSourceFile::GetLanguage_abi_cxx11_(&sysroot,this_00);
          std::__cxx11::string::operator=((string *)&linkLineComputer.StateDir,(string *)&sysroot);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sysroot._M_dataplus._M_p != &sysroot.field_2) {
            operator_delete(sysroot._M_dataplus._M_p,
                            CONCAT35(sysroot.field_2._M_allocated_capacity._5_3_,
                                     sysroot.field_2._M_allocated_capacity._0_5_) + 1);
          }
          if (linkLineComputer.StateDir.DirectoryState.Position != 0) {
            pmVar19 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData>_>_>
                      ::at(&languageDataMap,(key_type *)&linkLineComputer.StateDir);
            pcVar14 = cmGeneratorTarget::GetLocalGenerator(target);
            linkLanguageFlags._M_dataplus._M_p = (pointer)&linkLanguageFlags.field_2;
            pcVar4 = (pmVar19->Flags)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&linkLanguageFlags,pcVar4,
                       pcVar4 + (pmVar19->Flags)._M_string_length);
            sysroot.field_2._9_4_ = 0x5347414c;
            sysroot.field_2._M_allocated_capacity._0_5_ = 0x49504d4f43;
            sysroot.field_2._5_4_ = 0x465f454c;
            sysroot._M_string_length = 0xd;
            sysroot.field_2._M_local_buf[0xd] = '\0';
            sysroot._M_dataplus._M_p = (pointer)&sysroot.field_2;
            pcVar15 = cmSourceFile::GetProperty(this_00,&sysroot);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)sysroot._M_dataplus._M_p != &sysroot.field_2) {
              operator_delete(sysroot._M_dataplus._M_p,
                              CONCAT35(sysroot.field_2._M_allocated_capacity._5_3_,
                                       sysroot.field_2._M_allocated_capacity._0_5_) + 1);
            }
            if (pcVar15 != (char *)0x0) {
              cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&frameworkPath);
              cmGeneratorExpression::cmGeneratorExpression
                        ((cmGeneratorExpression *)&sysroot,(cmListFileBacktrace *)&frameworkPath);
              cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&frameworkPath);
              cmGeneratorExpression::Parse((cmGeneratorExpression *)&frameworkPath,(char *)&sysroot)
              ;
              linkPath._M_dataplus = frameworkPath._M_dataplus;
              frameworkPath._M_dataplus._M_p = (pointer)0x0;
              cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                        ((auto_ptr<cmCompiledGeneratorExpression> *)&frameworkPath);
              _Var23 = linkPath._M_dataplus;
              lg = cmGeneratorTarget::GetLocalGenerator(target);
              frameworkPath._M_string_length = 0;
              frameworkPath.field_2._M_allocated_capacity =
                   frameworkPath.field_2._M_allocated_capacity & 0xffffffffffffff00;
              frameworkPath._M_dataplus._M_p = (pointer)&frameworkPath.field_2;
              pcVar15 = cmCompiledGeneratorExpression::Evaluate
                                  ((cmCompiledGeneratorExpression *)_Var23._M_p,lg,config,false,
                                   (cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
                                   (cmGeneratorExpressionDAGChecker *)0x0,&frameworkPath);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)frameworkPath._M_dataplus._M_p != &frameworkPath.field_2) {
                operator_delete(frameworkPath._M_dataplus._M_p,
                                frameworkPath.field_2._M_allocated_capacity + 1);
              }
              (*pcVar14->_vptr_cmLocalGenerator[7])(pcVar14,&linkLanguageFlags,pcVar15);
              cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                        ((auto_ptr<cmCompiledGeneratorExpression> *)&linkPath);
              cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)&sysroot);
            }
            std::__cxx11::string::_M_assign
                      ((string *)&linkLineComputer.StateDir.Snapshot_.Position.Position);
            std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            ::operator=(&vStack_5a0,&pmVar19->IncludePathList);
            sysroot._M_string_length = sysroot._M_string_length & 0xffffffff00000000;
            sysroot.field_2._M_allocated_capacity._0_5_ = 0;
            psVar22 = &sysroot._M_string_length;
            sysroot.field_2._M_local_buf[8] = (char)psVar22;
            sysroot.field_2._5_4_ = (uint)(byte)sysroot.field_2._M_local_buf[8] << 0x18;
            sysroot.field_2._9_4_ = (undefined4)((ulong)psVar22 >> 8);
            sysroot.field_2._M_local_buf[0xd] = (char)((ulong)psVar22 >> 0x28);
            sysroot.field_2._14_2_ = (undefined2)((ulong)psVar22 >> 0x30);
            frameworkPath._M_dataplus._M_p = (pointer)&frameworkPath.field_2;
            linkPath._M_dataplus._M_p = (pointer)0x13;
            frameworkPath._M_dataplus._M_p =
                 (pointer)std::__cxx11::string::_M_create((ulong *)&frameworkPath,(ulong)&linkPath);
            frameworkPath.field_2._M_allocated_capacity = (size_type)linkPath._M_dataplus._M_p;
            builtin_strncpy(frameworkPath._M_dataplus._M_p,"COMPILE_DEFINITIONS",0x13);
            frameworkPath._M_string_length = (size_type)linkPath._M_dataplus._M_p;
            frameworkPath._M_dataplus._M_p[(long)linkPath._M_dataplus._M_p] = '\0';
            pcVar15 = cmSourceFile::GetProperty(this_00,&frameworkPath);
            cmLocalGenerator::AppendDefines
                      (pcVar14,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&sysroot,pcVar15);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)frameworkPath._M_dataplus._M_p != &frameworkPath.field_2) {
              operator_delete(frameworkPath._M_dataplus._M_p,
                              frameworkPath.field_2._M_allocated_capacity + 1);
            }
            cmsys::SystemTools::UpperCase(&linkPath,config);
            plVar21 = (long *)std::__cxx11::string::replace((ulong)&linkPath,0,(char *)0x0,0x55e7f1)
            ;
            frameworkPath._M_dataplus._M_p = (pointer)&frameworkPath.field_2;
            psVar22 = (size_type *)(plVar21 + 2);
            if ((size_type *)*plVar21 == psVar22) {
              frameworkPath.field_2._M_allocated_capacity = *psVar22;
              frameworkPath.field_2._8_8_ = plVar21[3];
            }
            else {
              frameworkPath.field_2._M_allocated_capacity = *psVar22;
              frameworkPath._M_dataplus._M_p = (pointer)*plVar21;
            }
            frameworkPath._M_string_length = plVar21[1];
            *plVar21 = (long)psVar22;
            plVar21[1] = 0;
            *(undefined1 *)(plVar21 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)linkPath._M_dataplus._M_p != &linkPath.field_2) {
              operator_delete(linkPath._M_dataplus._M_p,
                              CONCAT71(linkPath.field_2._M_allocated_capacity._1_7_,
                                       linkPath.field_2._M_local_buf[0]) + 1);
            }
            pcVar15 = cmSourceFile::GetProperty(this_00,&frameworkPath);
            cmLocalGenerator::AppendDefines
                      (pcVar14,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&sysroot,pcVar15);
            pbVar5 = (pmVar19->Defines).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            linkPath._M_dataplus._M_p = (pointer)&sysroot;
            for (__v = (pmVar19->Defines).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; __v != pbVar5; __v = __v + 1) {
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::
              _M_insert_unique_<std::__cxx11::string_const&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&sysroot,(const_iterator)&sysroot._M_string_length,__v,
                         (_Alloc_node *)&linkPath);
            }
            LanguageData::SetDefines
                      ((LanguageData *)&linkLineComputer,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&sysroot);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)frameworkPath._M_dataplus._M_p != &frameworkPath.field_2) {
              operator_delete(frameworkPath._M_dataplus._M_p,
                              frameworkPath.field_2._M_allocated_capacity + 1);
            }
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&sysroot);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)linkLanguageFlags._M_dataplus._M_p != &linkLanguageFlags.field_2) {
              operator_delete(linkLanguageFlags._M_dataplus._M_p,
                              linkLanguageFlags.field_2._M_allocated_capacity + 1);
            }
          }
          sysroot.field_2._M_allocated_capacity._0_5_ = 0x52454e4547;
          sysroot.field_2._5_4_ = 0x44455441;
          sysroot._M_string_length = 9;
          sysroot.field_2._9_4_ = sysroot.field_2._9_4_ & 0xffffff00;
          sysroot._M_dataplus._M_p = (pointer)&sysroot.field_2;
          bVar12 = cmSourceFile::GetPropertyAsBool(this_00,&sysroot);
          linkLineComputer._vptr_cmLinkLineComputer =
               (_func_int **)CONCAT71(linkLineComputer._vptr_cmLinkLineComputer._1_7_,bVar12);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sysroot._M_dataplus._M_p != &sysroot.field_2) {
            operator_delete(sysroot._M_dataplus._M_p,
                            CONCAT35(sysroot.field_2._M_allocated_capacity._5_3_,
                                     sysroot.field_2._M_allocated_capacity._0_5_) + 1);
          }
          this_01 = std::__detail::
                    _Map_base<LanguageData,_std::pair<const_LanguageData,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_LanguageData,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<LanguageData>,_std::hash<LanguageData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<LanguageData,_std::pair<const_LanguageData,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_LanguageData,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<LanguageData>,_std::hash<LanguageData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&artifacts,(key_type *)&linkLineComputer);
          psVar17 = cmSourceFile::GetFullPath(this_00,(string *)0x0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(this_01,psVar17);
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          ::~vector(&vStack_5a0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_5b8);
          if ((bool *)linkLineComputer.StateDir.Snapshot_.Position.Position !=
              &linkLineComputer.ForResponse) {
            operator_delete((void *)linkLineComputer.StateDir.Snapshot_.Position.Position,
                            CONCAT71(linkLineComputer._57_7_,linkLineComputer.ForResponse) + 1);
          }
          if (linkLineComputer.StateDir.DirectoryState.Tree !=
              (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)
              &linkLineComputer.StateDir.Snapshot_) {
            operator_delete(linkLineComputer.StateDir.DirectoryState.Tree,
                            (ulong)&((linkLineComputer.StateDir.Snapshot_.State)->
                                    PropertyDefinitions)._M_t._M_impl.field_0x1);
          }
        }
        pcVar15 = cmMakefile::GetCurrentSourceDirectory(target->Makefile);
        std::__cxx11::string::string((string *)&baseDir,pcVar15,(allocator *)&linkLineComputer);
        Json::Value::Value(&sourceGroupsValue,arrayValue);
        local_6a0 = artifacts.comments_;
        if (artifacts.comments_ != (CommentInfo *)0x0) {
          do {
            Json::Value::Value(&local_470,objectValue);
            if (local_6a0[3].comment_ != (char *)0x0) {
              Json::Value::Value((Value *)&linkLineComputer,(string *)(local_6a0 + 2));
              pVVar16 = Json::Value::operator[](&local_470,&kLANGUAGE_KEY_abi_cxx11_);
              Json::Value::operator=(pVVar16,(Value *)&linkLineComputer);
              Json::Value::~Value((Value *)&linkLineComputer);
              in = extraout_RDX;
              if (local_6a0[7].comment_ != (char *)0x0) {
                Json::Value::Value((Value *)&sysroot,(string *)(local_6a0 + 6));
                pVVar16 = Json::Value::operator[](&local_470,&kCOMPILE_FLAGS_KEY_abi_cxx11_);
                Json::Value::operator=(pVVar16,(Value *)&sysroot);
                Json::Value::~Value((Value *)&sysroot);
                in = extraout_RDX_00;
              }
              if (local_6a0[0xd].comment_ != local_6a0[0xe].comment_) {
                Json::Value::Value((Value *)&linkLanguageFlags,arrayValue);
                psVar6 = (string *)local_6a0[0xe].comment_;
                for (psVar17 = (string *)local_6a0[0xd].comment_; psVar17 != psVar6;
                    psVar17 = (string *)&psVar17[1]._M_string_length) {
                  Json::Value::Value((Value *)&frameworkPath,objectValue);
                  Json::Value::Value((Value *)&linkPath,psVar17);
                  pVVar16 = Json::Value::operator[]((Value *)&frameworkPath,&kPATH_KEY_abi_cxx11_);
                  Json::Value::operator=(pVVar16,(Value *)&linkPath);
                  Json::Value::~Value((Value *)&linkPath);
                  if (*(char *)&psVar17[1]._M_dataplus._M_p == '\x01') {
                    Json::Value::Value((Value *)&local_4c0,true);
                    pVVar16 = Json::Value::operator[]
                                        ((Value *)&frameworkPath,&kIS_SYSTEM_KEY_abi_cxx11_);
                    Json::Value::operator=(pVVar16,(Value *)&local_4c0);
                    Json::Value::~Value((Value *)&local_4c0);
                  }
                  Json::Value::append((Value *)&linkLanguageFlags,(Value *)&frameworkPath);
                  Json::Value::~Value((Value *)&frameworkPath);
                }
                Json::Value::Value((Value *)&frameworkPath,(Value *)&linkLanguageFlags);
                pVVar16 = Json::Value::operator[](&local_470,&kINCLUDE_PATH_KEY_abi_cxx11_);
                Json::Value::operator=(pVVar16,(Value *)&frameworkPath);
                Json::Value::~Value((Value *)&frameworkPath);
                Json::Value::~Value((Value *)&linkLanguageFlags);
                in = extraout_RDX_01;
              }
              if (local_6a0[10].comment_ != local_6a0[0xb].comment_) {
                (anonymous_namespace)::
                fromStringList<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          ((Value *)&linkLanguageFlags,(_anonymous_namespace_ *)(local_6a0 + 10),in)
                ;
                pVVar16 = Json::Value::operator[](&local_470,&kDEFINES_KEY_abi_cxx11_);
                Json::Value::operator=(pVVar16,(Value *)&linkLanguageFlags);
                Json::Value::~Value((Value *)&linkLanguageFlags);
              }
            }
            remote = local_6a0;
            Json::Value::Value((Value *)&local_350,*(bool *)&local_6a0[1].comment_);
            pVVar16 = Json::Value::operator[](&local_470,&kIS_GENERATED_KEY_abi_cxx11_);
            Json::Value::operator=(pVVar16,(Value *)&local_350);
            Json::Value::~Value((Value *)&local_350);
            Json::Value::Value(&sourcesValue,arrayValue);
            psVar6 = (string *)local_6a0[0x11].comment_;
            for (psVar17 = (string *)local_6a0[0x10].comment_; psVar17 != psVar6;
                psVar17 = psVar17 + 1) {
              cmSystemTools::RelativePath_abi_cxx11_
                        (&relPath,(cmSystemTools *)baseDir._M_dataplus._M_p,
                         (psVar17->_M_dataplus)._M_p,(char *)remote);
              value = &relPath;
              if (psVar17->_M_string_length <= relPath._M_string_length) {
                value = psVar17;
              }
              Json::Value::Value((Value *)&local_58,value);
              Json::Value::append(&sourcesValue,(Value *)&local_58);
              Json::Value::~Value((Value *)&local_58);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)relPath._M_dataplus._M_p != &relPath.field_2) {
                operator_delete(relPath._M_dataplus._M_p,relPath.field_2._M_allocated_capacity + 1);
              }
            }
            Json::Value::Value((Value *)&local_58,&sourcesValue);
            pVVar16 = Json::Value::operator[](&local_470,&kSOURCES_KEY_abi_cxx11_);
            Json::Value::operator=(pVVar16,(Value *)&local_58);
            Json::Value::~Value((Value *)&local_58);
            Json::Value::~Value(&sourcesValue);
            bVar12 = Json::Value::isNull(&local_470);
            if (!bVar12) {
              Json::Value::append(&sourceGroupsValue,&local_470);
            }
            Json::Value::~Value(&local_470);
            local_6a0 = (CommentInfo *)local_6a0->comment_;
          } while (local_6a0 != (CommentInfo *)0x0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)baseDir._M_dataplus._M_p != &baseDir.field_2) {
          operator_delete(baseDir._M_dataplus._M_p,baseDir.field_2._M_allocated_capacity + 1);
        }
        std::
        _Hashtable<LanguageData,_std::pair<const_LanguageData,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_LanguageData,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<LanguageData>,_std::hash<LanguageData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<LanguageData,_std::pair<const_LanguageData,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<const_LanguageData,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<LanguageData>,_std::hash<LanguageData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)&artifacts);
        if (files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)files.
                                super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)files.
                                super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        bVar12 = Json::Value::empty(&sourceGroupsValue);
        if (!bVar12) {
          Json::Value::Value(&local_300,&sourceGroupsValue);
          pVVar16 = Json::Value::operator[](__return_storage_ptr__,&kFILE_GROUPS_KEY_abi_cxx11_);
          Json::Value::operator=(pVVar16,&local_300);
          Json::Value::~Value(&local_300);
        }
        Json::Value::~Value(&sourceGroupsValue);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LanguageData>_>_>
        ::~_Rb_tree(&languageDataMap._M_t);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree(&languages._M_t);
        Json::Value::~Value(&statements);
        Json::Value::~Value(&crossRefs);
      }
      goto LAB_0046c2a4;
    }
  }
  Json::Value::Value(__return_storage_ptr__,nullValue);
LAB_0046c2a4:
  Json::Value::~Value(&ttl);
  pVVar16 = (Value *)&typeName.field_2;
  if ((Value *)typeName._M_dataplus._M_p != pVVar16) {
    operator_delete(typeName._M_dataplus._M_p,typeName.field_2._M_allocated_capacity + 1);
    pVVar16 = extraout_RAX;
  }
  return pVVar16;
}

Assistant:

static Json::Value DumpTarget(cmGeneratorTarget* target,
                              const std::string& config)
{
  cmLocalGenerator* lg = target->GetLocalGenerator();
  const cmState* state = lg->GetState();

  const cmStateEnums::TargetType type = target->GetType();
  const std::string typeName = state->GetTargetTypeName(type);

  Json::Value ttl = Json::arrayValue;
  ttl.append("EXECUTABLE");
  ttl.append("STATIC_LIBRARY");
  ttl.append("SHARED_LIBRARY");
  ttl.append("MODULE_LIBRARY");
  ttl.append("OBJECT_LIBRARY");
  ttl.append("UTILITY");
  ttl.append("INTERFACE_LIBRARY");

  if (!hasString(ttl, typeName) || target->IsImported()) {
    return Json::Value();
  }

  Json::Value result = Json::objectValue;
  result[kNAME_KEY] = target->GetName();
  result[kTYPE_KEY] = typeName;
  result[kSOURCE_DIRECTORY_KEY] = lg->GetCurrentSourceDirectory();
  result[kBUILD_DIRECTORY_KEY] = lg->GetCurrentBinaryDirectory();

  if (type == cmStateEnums::INTERFACE_LIBRARY) {
    return result;
  }

  result[kFULL_NAME_KEY] = target->GetFullName(config);

  Json::Value crossRefs = Json::objectValue;
  crossRefs[kBACKTRACE_KEY] = DumpBacktrace(target->Target->GetBacktrace());

  Json::Value statements = Json::arrayValue;
  DumpBacktraceRange(statements, "target_compile_definitions",
                     target->Target->GetCompileDefinitionsBacktraces());
  DumpBacktraceRange(statements, "target_include_directories",
                     target->Target->GetIncludeDirectoriesBacktraces());
  DumpBacktraceRange(statements, "target_compile_options",
                     target->Target->GetCompileOptionsBacktraces());
  DumpBacktraceRange(statements, "target_link_libraries",
                     target->Target->GetLinkImplementationBacktraces());

  crossRefs[kRELATED_STATEMENTS_KEY] = std::move(statements);
  result[kTARGET_CROSS_REFERENCES_KEY] = std::move(crossRefs);

  if (target->HaveWellDefinedOutputFiles()) {
    Json::Value artifacts = Json::arrayValue;
    artifacts.append(
      target->GetFullPath(config, cmStateEnums::RuntimeBinaryArtifact));
    if (target->IsDLLPlatform()) {
      artifacts.append(
        target->GetFullPath(config, cmStateEnums::ImportLibraryArtifact));
      const cmGeneratorTarget::OutputInfo* output =
        target->GetOutputInfo(config);
      if (output && !output->PdbDir.empty()) {
        artifacts.append(output->PdbDir + '/' + target->GetPDBName(config));
      }
    }
    result[kARTIFACTS_KEY] = artifacts;

    result[kLINKER_LANGUAGE_KEY] = target->GetLinkerLanguage(config);

    std::string linkLibs;
    std::string linkFlags;
    std::string linkLanguageFlags;
    std::string frameworkPath;
    std::string linkPath;
    cmLinkLineComputer linkLineComputer(lg,
                                        lg->GetStateSnapshot().GetDirectory());
    lg->GetTargetFlags(&linkLineComputer, config, linkLibs, linkLanguageFlags,
                       linkFlags, frameworkPath, linkPath, target);

    linkLibs = cmSystemTools::TrimWhitespace(linkLibs);
    linkFlags = cmSystemTools::TrimWhitespace(linkFlags);
    linkLanguageFlags = cmSystemTools::TrimWhitespace(linkLanguageFlags);
    frameworkPath = cmSystemTools::TrimWhitespace(frameworkPath);
    linkPath = cmSystemTools::TrimWhitespace(linkPath);

    if (!cmSystemTools::TrimWhitespace(linkLibs).empty()) {
      result[kLINK_LIBRARIES_KEY] = linkLibs;
    }
    if (!cmSystemTools::TrimWhitespace(linkFlags).empty()) {
      result[kLINK_FLAGS_KEY] = linkFlags;
    }
    if (!cmSystemTools::TrimWhitespace(linkLanguageFlags).empty()) {
      result[kLINK_LANGUAGE_FLAGS_KEY] = linkLanguageFlags;
    }
    if (!frameworkPath.empty()) {
      result[kFRAMEWORK_PATH_KEY] = frameworkPath;
    }
    if (!linkPath.empty()) {
      result[kLINK_PATH_KEY] = linkPath;
    }
    const std::string sysroot =
      lg->GetMakefile()->GetSafeDefinition("CMAKE_SYSROOT");
    if (!sysroot.empty()) {
      result[kSYSROOT_KEY] = sysroot;
    }
  }

  std::set<std::string> languages;
  target->GetLanguages(languages, config);
  std::map<std::string, LanguageData> languageDataMap;
  for (const auto& lang : languages) {
    LanguageData& ld = languageDataMap[lang];
    ld.Language = lang;
    lg->GetTargetCompileFlags(target, config, lang, ld.Flags);
    std::set<std::string> defines;
    lg->GetTargetDefines(target, config, lang, defines);
    ld.SetDefines(defines);
    std::vector<std::string> includePathList;
    lg->GetIncludeDirectories(includePathList, target, lang, config, true);
    for (auto i : includePathList) {
      ld.IncludePathList.push_back(
        std::make_pair(i, target->IsSystemIncludeDirectory(i, config)));
    }
  }

  Json::Value sourceGroupsValue =
    DumpSourceFilesList(target, config, languageDataMap);
  if (!sourceGroupsValue.empty()) {
    result[kFILE_GROUPS_KEY] = sourceGroupsValue;
  }

  return result;
}